

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QList<int>::resize(QList<int> *this,qsizetype size)

{
  int *piVar1;
  Data *pDVar2;
  long lVar3;
  int *piVar4;
  
  pDVar2 = (this->d).d;
  if (((pDVar2 == (Data *)0x0) ||
      (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar2->super_QArrayData).alloc -
      ((long)((long)(this->d).ptr -
             ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 2) <
      size)) {
    QArrayDataPointer<int>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(int **)0x0,(QArrayDataPointer<int> *)0x0);
  }
  else if (size < (this->d).size) {
    (this->d).size = size;
  }
  lVar3 = (this->d).size;
  if (lVar3 < size) {
    piVar4 = (this->d).ptr;
    piVar1 = piVar4 + lVar3;
    *piVar1 = 0;
    if (piVar1 + 1 != piVar4 + size) {
      memset(piVar1 + 1,0,(size * 4 + lVar3 * -4) - 4);
    }
    (this->d).size = size;
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }